

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Vec4<float> * Imath_3_2::operator*=(Vec4<float> *v,Matrix44<float> *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float w;
  float z;
  float y;
  float x;
  Matrix44<float> *m_local;
  Vec4<float> *v_local;
  
  fVar1 = v->x;
  fVar2 = m->x[0][1];
  fVar3 = m->x[1][1];
  fVar4 = m->x[2][1];
  fVar5 = m->x[3][1];
  fVar6 = v->x;
  fVar7 = m->x[0][2];
  fVar8 = v->y;
  fVar9 = m->x[1][2];
  fVar10 = m->x[2][2];
  fVar11 = m->x[3][2];
  fVar12 = v->x;
  fVar13 = m->x[0][3];
  fVar14 = v->y;
  fVar15 = m->x[1][3];
  fVar16 = v->z;
  fVar17 = m->x[2][3];
  fVar18 = m->x[3][3];
  v->x = v->w * m->x[3][0] + v->z * m->x[2][0] + v->x * m->x[0][0] + v->y * m->x[1][0];
  v->y = v->w * fVar5 + v->z * fVar4 + fVar1 * fVar2 + v->y * fVar3;
  v->z = v->w * fVar11 + v->z * fVar10 + fVar6 * fVar7 + fVar8 * fVar9;
  v->w = v->w * fVar18 + fVar16 * fVar17 + fVar12 * fVar13 + fVar14 * fVar15;
  return v;
}

Assistant:

IMATH_HOSTDEVICE inline const Vec4<S>&
operator*= (Vec4<S>& v, const Matrix44<T>& m) IMATH_NOEXCEPT
{
    S x = S (
        v.x * m.x[0][0] + v.y * m.x[1][0] + v.z * m.x[2][0] + v.w * m.x[3][0]);
    S y = S (
        v.x * m.x[0][1] + v.y * m.x[1][1] + v.z * m.x[2][1] + v.w * m.x[3][1]);
    S z = S (
        v.x * m.x[0][2] + v.y * m.x[1][2] + v.z * m.x[2][2] + v.w * m.x[3][2]);
    S w = S (
        v.x * m.x[0][3] + v.y * m.x[1][3] + v.z * m.x[2][3] + v.w * m.x[3][3]);

    v.x = x;
    v.y = y;
    v.z = z;
    v.w = w;

    return v;
}